

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::computeDivergence(MultiFab *divu,Array<const_MultiFab_*,_3> *umac,Geometry *geom)

{
  bool bVar1;
  CoordSys *in_RDX;
  MFIter *in_RDI;
  Box tbx;
  iterator __end3;
  iterator __begin3;
  range_impl<amrex::Box> *__range3;
  Array4<const_double> *warr;
  Array4<const_double> *varr;
  Array4<const_double> *uarr;
  Array4<double> *divuarr;
  Box *bx;
  MFIter mfi;
  GpuArray<double,_3U> dxinv;
  size_type in_stack_fffffffffffffd98;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdc7;
  FabArrayBase *in_stack_fffffffffffffdc8;
  MFIter *in_stack_fffffffffffffdd0;
  iterator local_220;
  MFIter *in_stack_fffffffffffffe00;
  Array4<const_double> local_1d8;
  Array4<const_double> *local_198;
  Array4<const_double> local_190;
  Array4<const_double> *local_150;
  Array4<const_double> local_148;
  Array4<const_double> *local_108;
  Array4<double> local_100;
  Array4<double> *local_c0;
  undefined1 local_b4 [28];
  undefined1 *local_98;
  MFIter local_90;
  GpuArray<double,_3U> local_30;
  MFIter *local_8;
  
  local_8 = in_RDI;
  CoordSys::InvCellSizeArray(&local_30,in_RDX);
  TilingIfNotGPU();
  MFIter::MFIter(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(bool)in_stack_fffffffffffffdc7
                );
  mfi_00 = local_8;
  while( true ) {
    bVar1 = MFIter::isValid(&local_90);
    if (!bVar1) break;
    MFIter::tilebox(in_stack_fffffffffffffe00);
    local_98 = local_b4;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_stack_fffffffffffffda8,mfi_00);
    local_c0 = &local_100;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)mfi_00,in_stack_fffffffffffffd98);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_stack_fffffffffffffda8,mfi_00);
    local_108 = &local_148;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)mfi_00,in_stack_fffffffffffffd98);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_stack_fffffffffffffda8,mfi_00);
    local_150 = &local_190;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)mfi_00,in_stack_fffffffffffffd98);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_stack_fffffffffffffda8,mfi_00);
    local_198 = &local_1d8;
    Gpu::Range<amrex::Box>((Box *)mfi_00);
    Gpu::range_detail::range_impl<amrex::Box>::begin((range_impl<amrex::Box> *)mfi_00);
    Gpu::range_detail::range_impl<amrex::Box>::end((range_impl<amrex::Box> *)mfi_00);
    while( true ) {
      bVar1 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                        (&local_220,(iterator *)&stack0xfffffffffffffdc8);
      if (!bVar1) break;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                ((Box *)&stack0xfffffffffffffdac,&local_220);
      amrex_compute_divergence
                ((Box *)&stack0xfffffffffffffdac,local_c0,local_108,local_150,local_198,&local_30);
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_220);
    }
    MFIter::operator++(&local_90);
  }
  MFIter::~MFIter(mfi_00);
  return;
}

Assistant:

void computeDivergence (MultiFab& divu, const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                            const Geometry& geom)
    {
        AMREX_D_TERM(AMREX_ASSERT(divu.nComp()==umac[0]->nComp());,
                     AMREX_ASSERT(divu.nComp()==umac[1]->nComp());,
                     AMREX_ASSERT(divu.nComp()==umac[2]->nComp()));

#if (AMREX_SPACEDIM==2)
        const auto& ba = divu.boxArray();
        const auto& dm = divu.DistributionMap();
        MultiFab volume, areax, areay;
        if (geom.IsRZ()) {
            geom.GetVolume(volume, ba, dm, 0);
            geom.GetFaceArea(areax, ba, dm, 0, 0);
            geom.GetFaceArea(areay, ba, dm, 1, 0);
        }
#endif

        const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(divu,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& divuarr = divu.array(mfi);
            AMREX_D_TERM(Array4<Real const> const& uarr = umac[0]->const_array(mfi);,
                         Array4<Real const> const& varr = umac[1]->const_array(mfi);,
                         Array4<Real const> const& warr = umac[2]->const_array(mfi););

#if (AMREX_SPACEDIM==2)
            if (geom.IsRZ()) {
                Array4<Real const> const&  ax =  areax.array(mfi);
                Array4<Real const> const&  ay =  areay.array(mfi);
                Array4<Real const> const& vol = volume.array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_divergence_rz(tbx,divuarr,AMREX_D_DECL(uarr,varr,warr),ax,ay,vol);
                });
            } else
#endif
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_divergence(tbx,divuarr,AMREX_D_DECL(uarr,varr,warr),dxinv);
                });
            }
        }
    }